

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

int fix_unset_addr_list(UnsetAddrList *uslist,regex_t *reg)

{
  uint uVar1;
  _Node **pp_Var2;
  int iVar3;
  long lVar4;
  
  iVar3 = uslist->num;
  if (0 < iVar3) {
    pp_Var2 = &uslist->us->target;
    lVar4 = 0;
    do {
      uVar1 = ((*pp_Var2)->u).base.status;
      if ((uVar1 >> 8 & 1) == 0) {
        if ((char)uVar1 < '\0') {
          return -0xb;
        }
      }
      else {
        *(Bits *)((long)&reg->ops->opaddr + (long)((UnsetAddr *)(pp_Var2 + -1))->offset) =
             ((*pp_Var2)->u).cclass.bs[4];
        iVar3 = uslist->num;
      }
      lVar4 = lVar4 + 1;
      pp_Var2 = pp_Var2 + 2;
    } while (lVar4 < iVar3);
  }
  return 0;
}

Assistant:

static int
fix_unset_addr_list(UnsetAddrList* uslist, regex_t* reg)
{
  int i, offset;
  BagNode* en;
  AbsAddrType addr;
  AbsAddrType* paddr;

  for (i = 0; i < uslist->num; i++) {
    if (! ND_IS_FIXED_ADDR(uslist->us[i].target)) {
      if (ND_IS_CALLED(uslist->us[i].target))
        return ONIGERR_PARSER_BUG;
      else {
        /* CASE: called node doesn't have called address.
           ex. /((|a\g<1>)(.){0}){0}\g<3>/
           group-1 doesn't called, but compiled into bytecodes,
           because group-3 is referred from outside.
        */
        continue;
      }
    }

    en = BAG_(uslist->us[i].target);
    addr   = en->m.called_addr;
    offset = uslist->us[i].offset;

    paddr = (AbsAddrType* )((char* )reg->ops + offset);
    *paddr = addr;
  }
  return 0;
}